

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTcParser::parse_local_initializer(CTcParser *this,CTcSymLocal *lcl,int *err)

{
  CTcPrsNode *left;
  long in_RSI;
  CTPNAsi *in_RDI;
  CTcPrsNode *expr;
  CTcSymbol *in_stack_ffffffffffffff88;
  CTcTokenizer *in_stack_ffffffffffffff98;
  CTPNSymResolved *local_8;
  
  CTcTokenizer::next(in_stack_ffffffffffffff98);
  local_8 = (CTPNSymResolved *)parse_asi_expr((CTcParser *)0x2ba726);
  if (local_8 == (CTPNSymResolved *)0x0) {
    local_8 = (CTPNSymResolved *)0x0;
  }
  else if (in_RSI != 0) {
    local_8 = (CTPNSymResolved *)CTcPrsAllocObj::operator_new(0x2ba760);
    left = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2ba77c);
    CTPNSymResolved::CTPNSymResolved(local_8,in_stack_ffffffffffffff88);
    CTPNAsi::CTPNAsi(in_RDI,left,(CTcPrsNode *)local_8);
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcParser::parse_local_initializer(CTcSymLocal *lcl, int *err)
{
    /* 
     *   skip the assignment operator and parse the expression (which
     *   cannot use the comma operator) 
     */
    G_tok->next();
    CTcPrsNode *expr = parse_asi_expr();

    /* if that failed, return failure */
    if (expr == 0)
        return 0;

    /* 
     *   if we have a valid local, return a new expression node for the
     *   assignment; otherwise just return the expression, since we have
     *   nothing to assign to 
     */
    return (lcl != 0 ? new CTPNAsi(new CTPNSymResolved(lcl), expr) : expr);
}